

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O2

bool __thiscall tinyusdz::ascii::AsciiParser::SkipUntilNewline(AsciiParser *this)

{
  StreamReader *pSVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  char d;
  char c;
  
  do {
    bVar3 = Eof(this);
    if (bVar3) goto LAB_0028abaa;
    bVar3 = Char1(this,&c);
    if (!bVar3) goto LAB_0028aba6;
    iVar4 = 0;
    if (c == '\r') {
      if (this->_sr->idx_ < this->_sr->length_ - 1) {
        bVar3 = Char1(this,&d);
        iVar2 = 1;
        iVar4 = iVar2;
        if ((bVar3) && (iVar4 = 3, d != '\n')) {
          pSVar1 = this->_sr;
          iVar4 = iVar2;
          if ((0 < (long)pSVar1->idx_) && (uVar5 = pSVar1->idx_ - 1, uVar5 <= pSVar1->length_)) {
            pSVar1->idx_ = uVar5;
            iVar4 = 3;
          }
        }
      }
    }
    else if (c == '\n') goto LAB_0028abaa;
  } while (iVar4 == 0);
  if (iVar4 == 1) {
LAB_0028aba6:
    bVar3 = false;
  }
  else {
LAB_0028abaa:
    (this->_curr_cursor).row = (this->_curr_cursor).row + 1;
    (this->_curr_cursor).col = 0;
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool AsciiParser::SkipUntilNewline() {
  while (!Eof()) {
    char c;
    if (!Char1(&c)) {
      // this should not happen.
      return false;
    }

    if (c == '\n') {
      break;
    } else if (c == '\r') {
      // CRLF?
      if (_sr->tell() < (_sr->size() - 1)) {
        char d;
        if (!Char1(&d)) {
          // this should not happen.
          return false;
        }

        if (d == '\n') {
          break;
        }

        // unwind 1 char
        if (!_sr->seek_from_current(-1)) {
          // this should not happen.
          return false;
        }

        break;
      }

    } else {
      // continue
    }
  }

  _curr_cursor.row++;
  _curr_cursor.col = 0;
  return true;
}